

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O0

int google::FileGetElfType(int fd)

{
  bool bVar1;
  int iVar2;
  int local_50 [2];
  Elf64_Ehdr elf_header;
  int fd_local;
  
  elf_header._56_4_ = fd;
  bVar1 = ReadFromOffsetExact(fd,local_50,0x40,0);
  if (bVar1) {
    if (local_50[0] == 0x464c457f) {
      elf_header._60_4_ = ZEXT24((ushort)elf_header.e_ident._8_2_);
    }
    else {
      elf_header.e_shnum = 0xffff;
      elf_header.e_shstrndx = 0xffff;
    }
  }
  else {
    elf_header.e_shnum = 0xffff;
    elf_header.e_shstrndx = 0xffff;
  }
  iVar2._0_2_ = elf_header.e_shnum;
  iVar2._2_2_ = elf_header.e_shstrndx;
  return iVar2;
}

Assistant:

static int FileGetElfType(const int fd) {
  ElfW(Ehdr) elf_header;
  if (!ReadFromOffsetExact(fd, &elf_header, sizeof(elf_header), 0)) {
    return -1;
  }
  if (memcmp(elf_header.e_ident, ELFMAG, SELFMAG) != 0) {
    return -1;
  }
  return elf_header.e_type;
}